

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O0

int __thiscall wabt::string_view::compare(string_view *this,string_view s)

{
  unsigned_long *puVar1;
  int result;
  size_type rlen;
  string_view *this_local;
  string_view s_local;
  
  s_local.data_ = (char *)s.size_;
  puVar1 = std::min<unsigned_long>(&this->size_,(unsigned_long *)&s_local);
  s_local.size_._4_4_ = std::char_traits<char>::compare(this->data_,s.data_,*puVar1);
  if (((s_local.size_._4_4_ == 0) && ((char *)this->size_ != s_local.data_)) &&
     (s_local.size_._4_4_ = 1, (char *)this->size_ < s_local.data_)) {
    s_local.size_._4_4_ = -1;
  }
  return s_local.size_._4_4_;
}

Assistant:

int string_view::compare(string_view s) const noexcept {
  size_type rlen = std::min(size_, s.size_);
  int result = traits_type::compare(data_, s.data_, rlen);
  if (result != 0 || size_ == s.size_) {
    return result;
  }
  return size_ < s.size_ ? -1 : 1;
}